

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

Result __thiscall tonk::gateway::ParsedURL::Parse(ParsedURL *this,string *url)

{
  undefined2 uVar1;
  int iVar2;
  long lVar3;
  ErrorResult *this_00;
  ulong in_RDX;
  Result *success;
  long lVar4;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  string ip;
  error_code ec;
  string path;
  
  std::__cxx11::string::_M_assign((string *)url);
  lVar3 = std::__cxx11::string::find((char)in_RDX,0x3a);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  lVar4 = -1;
  if (lVar3 + 1 != 0) {
    lVar4 = lVar3 + 1;
  }
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)in_RDX,0x2f);
  if (lVar3 == -1) {
    path._M_string_length = 0;
    *path._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&ip,in_RDX);
    std::__cxx11::string::operator=((string *)&path,(string *)&ip);
    std::__cxx11::string::~string((string *)&ip);
  }
  if (lVar4 == -1) {
    iVar2 = 0x50;
LAB_0012e92d:
    std::__cxx11::string::substr((ulong)&ip,in_RDX);
    std::__cxx11::string::_M_assign((string *)(url + 2));
    uVar1 = 0x50;
    if (iVar2 != 0x1bb) {
      uVar1 = (undefined2)iVar2;
    }
    *(undefined2 *)&url[3]._M_dataplus._M_p = uVar1;
    std::__cxx11::string::_M_assign((string *)(url + 1));
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    asio::ip::make_address((address *)local_a0,ip._M_dataplus._M_p,&ec);
    url[3]._M_string_length = local_a0._0_8_;
    url[3].field_2._M_allocated_capacity = CONCAT44(local_a0._12_4_,local_a0._8_4_);
    *(ulong *)((long)&url[3].field_2 + 8) =
         CONCAT44(aStack_90._M_allocated_capacity._4_4_,aStack_90._M_allocated_capacity._0_4_);
    url[4]._M_dataplus._M_p = (pointer)CONCAT44(aStack_90._12_4_,aStack_90._8_4_);
    if (ec._M_value == 0) {
      asio::ip::detail::endpoint::endpoint
                ((endpoint *)local_a0,(address *)&url[3]._M_string_length,
                 *(unsigned_short *)&url[3]._M_dataplus._M_p);
      *(ulong *)((long)&url[4].field_2 + 4) =
           CONCAT44(aStack_90._M_allocated_capacity._0_4_,local_a0._12_4_);
      *(ulong *)((long)&url[4].field_2 + 0xc) =
           CONCAT44(aStack_90._8_4_,aStack_90._M_allocated_capacity._4_4_);
      url[4]._M_string_length = local_a0._0_8_;
      url[4].field_2._M_allocated_capacity = CONCAT44(local_a0._12_4_,local_a0._8_4_);
      (this->FullURL)._M_dataplus._M_p = (pointer)0x0;
      goto LAB_0012ea7b;
    }
    (**(code **)(*(long *)ec._M_cat + 0x20))(local_a0);
    lVar4 = (long)ec._M_value;
    this_00 = (ErrorResult *)operator_new(0x38);
    this_00->Source = "retrieveDescription: Invalid IP string";
    std::__cxx11::string::string((string *)&this_00->Description,(string *)local_a0);
    this_00->Type = Asio;
    this_00->Code = lVar4;
  }
  else {
    std::__cxx11::string::substr((ulong)&ip,in_RDX);
    iVar2 = atoi(ip._M_dataplus._M_p);
    if (0 < iVar2) {
      std::__cxx11::string::~string((string *)&ip);
      goto LAB_0012e92d;
    }
    std::__cxx11::string::string((string *)local_a0,"Port did not parse",(allocator *)&ec);
    this_00 = (ErrorResult *)operator_new(0x38);
    ErrorResult::ErrorResult(this_00,(string *)local_a0);
  }
  (this->FullURL)._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::~string((string *)local_a0);
LAB_0012ea7b:
  std::__cxx11::string::~string((string *)&ip);
  std::__cxx11::string::~string((string *)&path);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result ParsedURL::Parse(const std::string& url)
{
    FullURL = url;

    size_t ipEnd, slash;

    // Find port offset
    size_t portStart = url.find(':');
    if (portStart == std::string::npos) {
        ipEnd = url.length();
        slash = std::string::npos;
    }
    else {
        ipEnd = portStart;
        ++portStart;
        slash = portStart;
    }

    size_t portEnd;
    std::string path;
    int port;

    // Find path offset relative to port
    slash = url.find('/', slash);
    if (slash == std::string::npos) {
        portEnd = url.length();
        path.clear();
    }
    else {
        portEnd = slash;
        if (ipEnd > slash) {
            ipEnd = slash;
        }
        path = url.substr(slash + 1);
    }

    // Parse out port field
    if (portStart == std::string::npos) {
        port = 80; // Default HTTP port
    }
    else {
        const std::string portStr = url.substr(portStart, portEnd - portStart);
        port = atoi(portStr.c_str());
        if (port <= 0) {
            return Result("Port did not parse");
        }
    }

    // Note that regardless of protocol we always connect on port 80 with
    // HTTP (no SSL encryption) unless a port is specified in the URL
    if (port == 443) {
        // Force port 80 instead of HTTPS since we do not support encryption
        port = 80;
    }

    // Parse out IP field
    std::string ip = url.substr(0, ipEnd);

    // Fill info
    IP = ip;
    Port = (uint16_t)port;
    XMLPath = path;

    asio::error_code ec;

    // Convert IP string to IP address
    IPAddr = asio::ip::make_address(ip, ec);

    if (ec) {
        return Result("retrieveDescription: Invalid IP string", ec.message(), ErrorType::Asio, ec.value());
    }

    TCPEndpoint = asio::ip::tcp::endpoint(IPAddr, Port);

    return Result::Success();
}